

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

optional<sub_bound_token> *
read_left_bound_token
          (optional<sub_bound_token> *__return_storage_ptr__,string_view buf_1,string_view buf_2,
          string_view buf_3,string_view buf_4)

{
  char cVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  _Storage<operator_token,_true> _Var4;
  int iVar5;
  char *pcVar6;
  _Storage<double,_true> _Var7;
  undefined1 auVar8 [16];
  undefined8 in_XMM0_Qb;
  optional<double> oVar9;
  optional<operator_token> oVar10;
  
  pcVar6 = buf_1._M_str;
  if ((buf_1._M_len == 1) && ((*pcVar6 == '+' || (*pcVar6 == '-')))) {
    cVar1 = *pcVar6;
    oVar9 = read_real(buf_2);
    if (((undefined1  [16])
         oVar9.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      oVar10 = read_operator(buf_3,buf_4);
      _Var4 = oVar10.super__Optional_base<operator_token,_true,_true>._M_payload.
              super__Optional_payload_base<operator_token>._M_payload;
      if (((undefined1  [12])
           oVar10.super__Optional_base<operator_token,_true,_true>._M_payload.
           super__Optional_payload_base<operator_token> & (undefined1  [12])0x1) !=
          (undefined1  [12])0x0) {
        auVar2._8_8_ = in_XMM0_Qb;
        auVar2._0_8_ = oVar9.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_payload;
        auVar8._8_8_ = 0x8000000000000000;
        auVar8._0_8_ = 0x8000000000000000;
        auVar8 = vxorpd_avx512vl(auVar2,auVar8);
        iVar5 = 2;
        _Var7 = (_Storage<double,_true>)
                ((ulong)(cVar1 == '-') * auVar8._0_8_ +
                (ulong)(cVar1 != '-') *
                (long)oVar9.super__Optional_base<double,_true,_true>._M_payload.
                      super__Optional_payload_base<double>._M_payload);
LAB_0013abdf:
        (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
        super__Optional_payload_base<sub_bound_token>._M_payload._M_value.value = (double)_Var7;
        (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
        super__Optional_payload_base<sub_bound_token>._M_payload._M_value.read =
             _Var4._M_value.read + iVar5;
        (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
        super__Optional_payload_base<sub_bound_token>._M_payload._M_value.op = _Var4._M_value.op;
        bVar3 = true;
        goto LAB_0013abf8;
      }
    }
  }
  else {
    oVar9 = read_real(buf_1);
    _Var7 = oVar9.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_payload;
    if (((undefined1  [16])
         oVar9.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      oVar10 = read_operator(buf_2,buf_3);
      _Var4 = oVar10.super__Optional_base<operator_token,_true,_true>._M_payload.
              super__Optional_payload_base<operator_token>._M_payload;
      if (((undefined1  [12])
           oVar10.super__Optional_base<operator_token,_true,_true>._M_payload.
           super__Optional_payload_base<operator_token> & (undefined1  [12])0x1) !=
          (undefined1  [12])0x0) {
        iVar5 = 1;
        goto LAB_0013abdf;
      }
    }
  }
  bVar3 = false;
LAB_0013abf8:
  (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
  super__Optional_payload_base<sub_bound_token>._M_engaged = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::optional<sub_bound_token>
read_left_bound_token(const std::string_view buf_1,
                      const std::string_view buf_2,
                      const std::string_view buf_3,
                      const std::string_view buf_4) noexcept
{
    double value = 0.0;
    double negative = 1.0;

    if (buf_1 == "+" || buf_1 == "-") {
        if (buf_1 == "-")
            negative = -1.0;

        if (auto value_opt = read_real(buf_2); value_opt)
            value = *value_opt;
        else
            return std::nullopt;

        if (auto operator_token = read_operator(buf_3, buf_4); operator_token)
            return sub_bound_token(
              value * negative, operator_token->read + 2, operator_token->op);
        else
            return std::nullopt;
    } else {
        if (auto value_opt = read_real(buf_1); value_opt)
            value = *value_opt;
        else
            return std::nullopt;

        if (auto operator_token = read_operator(buf_2, buf_3); operator_token)
            return sub_bound_token(
              value * negative, operator_token->read + 1, operator_token->op);
        else
            return std::nullopt;
    }
}